

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

void __thiscall
TxRequestTracker::Impl::RequestedTx(Impl *this,NodeId peer,uint256 *txhash,microseconds expiry)

{
  long *plVar1;
  size_type *psVar2;
  ulong uVar3;
  bool bVar4;
  iterator x;
  iterator iVar5;
  iterator x_00;
  _Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false> _Var6;
  long *plVar7;
  type *this_00;
  long in_FS_OFFSET;
  tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->m_index).super_type;
  local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_READY;
  local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<2UL,_unsigned_long,_false>)(_Head_base<2UL,_unsigned_long,_false>)txhash;
  local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = (uint256 *)peer;
  x = boost::multi_index::detail::
      ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
      ::find<std::tuple<long,bool,uint256_const&>>
                ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                  *)this_00,(tuple<long,_bool,_const_uint256_&> *)&local_50);
  if (x.node == (this->m_index).
                super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                .member) {
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_DELAYED;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_long,_false>)(_Head_base<2UL,_unsigned_long,_false>)txhash;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = (uint256 *)peer;
    x = boost::multi_index::detail::
        ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
        ::find<std::tuple<long,bool,uint256_const&>>
                  ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                    *)this_00,(tuple<long,_bool,_const_uint256_&> *)&local_50);
    if ((x.node == (this->m_index).
                   super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                   .member) ||
       (*(ulong *)((long)&((x.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                          ).
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          .
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) >> 0x3e != 0)) goto LAB_00356469;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_long,_false>)0;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl = CANDIDATE_BEST;
    local_50.super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>.
    super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = txhash;
    x_00 = boost::multi_index::detail::
           ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>,boost::multi_index::detail::nth_layer<2,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByTxHash,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
           ::lower_bound<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>
                     ((ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>,boost::multi_index::detail::nth_layer<2,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByTxHash,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                       *)this_00,&local_50);
    if (((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
          *)x_00.node !=
         (this->m_index).
         super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
         .member) &&
       (bVar4 = ::operator==((base_blob<256U> *)x_00.node,&txhash->super_base_blob<256U>), bVar4)) {
      uVar3 = *(ulong *)((long)&((x_00.node)->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                ).
                                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                data_ + 0x30);
      if (uVar3 >> 0x3d == 3) {
        _Var6._M_cur = (__node_type *)
                       std::
                       unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                       ::find(&this->m_peerinfo,
                              (key_type *)
                              (((x_00.node)->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               ).
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf + 0x28));
        *(long *)((long)_Var6._M_cur + 0x18) =
             *(long *)((long)_Var6._M_cur + 0x18) -
             (ulong)((uVar3 & 0xe000000000000000) == 0x8000000000000000);
        *(long *)((long)_Var6._M_cur + 0x20) =
             *(long *)((long)_Var6._M_cur + 0x20) -
             (ulong)((*(ulong *)((long)&((x_00.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000);
        *(ulong *)((long)&((x_00.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) =
             *(ulong *)((long)&((x_00.node)->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               ).
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_ + 0x30) & 0x1fffffffffffffff | 0x8000000000000000;
        bVar4 = boost::multi_index::detail::
                ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::modify_(&this_00->super_type,(index_node_type *)x_00.node);
      }
      else {
        if ((uint)(uVar3 >> 0x3d) != 2) goto LAB_003563c2;
        _Var6._M_cur = (__node_type *)
                       std::
                       unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                       ::find(&this->m_peerinfo,
                              (key_type *)
                              (((x_00.node)->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               ).
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf + 0x28));
        *(long *)((long)_Var6._M_cur + 0x18) =
             *(long *)((long)_Var6._M_cur + 0x18) -
             (ulong)((uVar3 & 0xe000000000000000) == 0x8000000000000000);
        *(long *)((long)_Var6._M_cur + 0x20) =
             *(long *)((long)_Var6._M_cur + 0x20) -
             (ulong)((*(ulong *)((long)&((x_00.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000);
        *(ulong *)((long)&((x_00.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) =
             (*(ulong *)((long)&((x_00.node)->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                ).
                                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                data_ + 0x30) & 0x1fffffffffffffff) + 0x2000000000000000;
        bVar4 = boost::multi_index::detail::
                ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::modify_(&this_00->super_type,(index_node_type *)x_00.node);
      }
      plVar1 = (long *)((long)&((_Var6._M_cur)->
                               super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                               ._M_storage._M_storage + 0x10);
      plVar7 = (long *)((long)&((_Var6._M_cur)->
                               super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                               ._M_storage._M_storage + 0x18);
      if (bVar4 == false) {
        operator_delete(x_00.node,0x80);
        psVar2 = &(this->m_index).node_count;
        *psVar2 = *psVar2 - 1;
      }
      *plVar1 = *plVar1 + (ulong)((*(ulong *)((long)&((x_00.node)->
                                                                                                          
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  ).
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x30) & 0xe000000000000000) ==
                                 0x8000000000000000);
      *plVar7 = *plVar7 + (ulong)((*(ulong *)((long)&((x_00.node)->
                                                                                                          
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                                  ).
                                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                                  .
                                                  super_pod_value_holder<(anonymous_namespace)::Announcement>
                                                  .space.data_ + 0x30) & 0xe000000000000000) ==
                                 0x6000000000000000);
    }
  }
LAB_003563c2:
  iVar5 = std::
          unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
          ::find(&this->m_peerinfo,
                 (key_type *)
                 (((x.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                  ).
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  .
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf +
                 0x28));
  *(long *)((long)iVar5.
                  super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                  ._M_cur + 0x18) =
       *(long *)((long)iVar5.
                       super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                       ._M_cur + 0x18) -
       (ulong)((uint)((ulong)*(undefined8 *)
                              ((long)&((x.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                      ).
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      .
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) >> 0x3d) == 4);
  *(long *)((long)iVar5.
                  super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                  ._M_cur + 0x20) =
       *(long *)((long)iVar5.
                       super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                       ._M_cur + 0x20) -
       (ulong)((uint)((ulong)*(undefined8 *)
                              ((long)&((x.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                      ).
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      .
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) >> 0x3d) == 3);
  *(ulong *)((long)&((x.node)->
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                    ).
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                    .
                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ + 0x30)
       = *(ulong *)((long)&((x.node)->
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                           ).
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                           .
                           super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                           .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                   + 0x30) & 0x1fffffffffffffff | 0x6000000000000000;
  *(rep *)((long)&((x.node)->
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                  ).
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                  .
                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ + 0x20) =
       expiry.__r;
  bVar4 = boost::multi_index::detail::
          ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::modify_(&this_00->super_type,x.node);
  if (!bVar4) {
    operator_delete(x.node,0x80);
    psVar2 = &(this->m_index).node_count;
    *psVar2 = *psVar2 - 1;
  }
  *(long *)((long)iVar5.
                  super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                  ._M_cur + 0x18) =
       *(long *)((long)iVar5.
                       super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                       ._M_cur + 0x18) +
       (ulong)((*(ulong *)((long)&((x.node)->
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                  ).
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                  .
                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space
                                  .data_ + 0x30) & 0xe000000000000000) == 0x8000000000000000);
  *(long *)((long)iVar5.
                  super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                  ._M_cur + 0x20) =
       *(long *)((long)iVar5.
                       super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                       ._M_cur + 0x20) +
       (ulong)((*(ulong *)((long)&((x.node)->
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                  ).
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                  .
                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space
                                  .data_ + 0x30) & 0xe000000000000000) == 0x6000000000000000);
LAB_00356469:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RequestedTx(NodeId peer, const uint256& txhash, std::chrono::microseconds expiry)
    {
        auto it = m_index.get<ByPeer>().find(ByPeerView{peer, true, txhash});
        if (it == m_index.get<ByPeer>().end()) {
            // There is no CANDIDATE_BEST announcement, look for a _READY or _DELAYED instead. If the caller only
            // ever invokes RequestedTx with the values returned by GetRequestable, and no other non-const functions
            // other than ForgetTxHash and GetRequestable in between, this branch will never execute (as txhashes
            // returned by GetRequestable always correspond to CANDIDATE_BEST announcements).

            it = m_index.get<ByPeer>().find(ByPeerView{peer, false, txhash});
            if (it == m_index.get<ByPeer>().end() || (it->GetState() != State::CANDIDATE_DELAYED &&
                                                      it->GetState() != State::CANDIDATE_READY)) {
                // There is no CANDIDATE announcement tracked for this peer, so we have nothing to do. Either this
                // txhash wasn't tracked at all (and the caller should have called ReceivedInv), or it was already
                // requested and/or completed for other reasons and this is just a superfluous RequestedTx call.
                return;
            }

            // Look for an existing CANDIDATE_BEST or REQUESTED with the same txhash. We only need to do this if the
            // found announcement had a different state than CANDIDATE_BEST. If it did, invariants guarantee that no
            // other CANDIDATE_BEST or REQUESTED can exist.
            auto it_old = m_index.get<ByTxHash>().lower_bound(ByTxHashView{txhash, State::CANDIDATE_BEST, 0});
            if (it_old != m_index.get<ByTxHash>().end() && it_old->m_txhash == txhash) {
                if (it_old->GetState() == State::CANDIDATE_BEST) {
                    // The data structure's invariants require that there can be at most one CANDIDATE_BEST or one
                    // REQUESTED announcement per txhash (but not both simultaneously), so we have to convert any
                    // existing CANDIDATE_BEST to another CANDIDATE_* when constructing another REQUESTED.
                    // It doesn't matter whether we pick CANDIDATE_READY or _DELAYED here, as SetTimePoint()
                    // will correct it at GetRequestable() time. If time only goes forward, it will always be
                    // _READY, so pick that to avoid extra work in SetTimePoint().
                    Modify<ByTxHash>(it_old, [](Announcement& ann) { ann.SetState(State::CANDIDATE_READY); });
                } else if (it_old->GetState() == State::REQUESTED) {
                    // As we're no longer waiting for a response to the previous REQUESTED announcement, convert it
                    // to COMPLETED. This also helps guaranteeing progress.
                    Modify<ByTxHash>(it_old, [](Announcement& ann) { ann.SetState(State::COMPLETED); });
                }
            }
        }

        Modify<ByPeer>(it, [expiry](Announcement& ann) {
            ann.SetState(State::REQUESTED);
            ann.m_time = expiry;
        });
    }